

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_uint32_iterator_move_equalorlarger(roaring_uint32_iterator_t *it,uint32_t val)

{
  byte bVar1;
  _Bool _Var2;
  undefined2 uVar3;
  uint16_t uVar4;
  uint32_t val_00;
  uint in_ESI;
  long in_RDI;
  uint16_t lb;
  uint32_t lowvalue;
  int i;
  uint16_t hb;
  undefined6 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffde;
  uint in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  uVar3 = (undefined2)(in_ESI >> 0x10);
  val_00 = ra_get_index((roaring_array_t *)
                        CONCAT26(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8),0);
  if ((int)val_00 < 0) {
    *(uint32_t *)(in_RDI + 0x14) = -1 - val_00;
  }
  else {
    uVar4 = container_maximum((container_t *)
                              CONCAT26(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8),'\0');
    in_stack_ffffffffffffffe0 = (uint)uVar4;
    if ((in_ESI & 0xffff) <= in_stack_ffffffffffffffe0) {
      *(uint32_t *)(in_RDI + 0x14) = val_00;
      _Var2 = loadfirstvalue_largeorequal
                        ((roaring_uint32_iterator_t *)
                         CONCAT44(in_ESI,CONCAT22(uVar3,in_stack_ffffffffffffffe8)),val_00);
      *(_Bool *)(in_RDI + 0x24) = _Var2;
      bVar1 = *(byte *)(in_RDI + 0x24);
      goto LAB_0010e13b;
    }
    *(uint32_t *)(in_RDI + 0x14) = val_00 + 1;
  }
  _Var2 = loadfirstvalue((roaring_uint32_iterator_t *)CONCAT44(val_00,in_stack_ffffffffffffffe0));
  *(_Bool *)(in_RDI + 0x24) = _Var2;
  bVar1 = *(byte *)(in_RDI + 0x24);
LAB_0010e13b:
  local_1 = (_Bool)(bVar1 & 1);
  return local_1;
}

Assistant:

bool roaring_uint32_iterator_move_equalorlarger(roaring_uint32_iterator_t *it,
                                                uint32_t val) {
    uint16_t hb = val >> 16;
    const int i = ra_get_index(&it->parent->high_low_container, hb);
    if (i >= 0) {
        uint32_t lowvalue =
            container_maximum(it->parent->high_low_container.containers[i],
                              it->parent->high_low_container.typecodes[i]);
        uint16_t lb = val & 0xFFFF;
        if (lowvalue < lb) {
            // will have to load first value of next container
            it->container_index = i + 1;
        } else {
            // the value is necessarily within the range of the container
            it->container_index = i;
            it->has_value = loadfirstvalue_largeorequal(it, val);
            return it->has_value;
        }
    } else {
        // there is no matching, so we are going for the next container
        it->container_index = -i - 1;
    }
    it->has_value = loadfirstvalue(it);
    return it->has_value;
}